

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFDie::findRecursively
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFDie *this,
          ArrayRef<llvm::dwarf::Attribute> Attrs)

{
  bool bVar1;
  reference pvVar2;
  pair<llvm::NoneType,_bool> pVar3;
  DWARFDie DVar4;
  undefined1 local_118 [8];
  DWARFDie D_1;
  undefined1 local_100 [8];
  DWARFDie D;
  undefined1 auStack_d8 [8];
  DWARFDie Die;
  undefined1 local_b8 [8];
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> Seen;
  undefined1 local_38 [8];
  vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> Worklist;
  DWARFDie *this_local;
  ArrayRef<llvm::dwarf::Attribute> Attrs_local;
  
  Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = this;
  std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::vector
            ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_38);
  std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::push_back
            ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_38,this);
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::SmallSet
            ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_b8);
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
            ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_b8,this);
  while (bVar1 = std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::empty
                           ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_38),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::back
                       ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_38);
    auStack_d8 = (undefined1  [8])pvVar2->U;
    Die.U = (DWARFUnit *)pvVar2->Die;
    std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::pop_back
              ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_38);
    bVar1 = isValid((DWARFDie *)auStack_d8);
    if (bVar1) {
      find(__return_storage_ptr__,(DWARFDie *)auStack_d8,Attrs);
      bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)__return_storage_ptr__);
      if (bVar1) goto LAB_02813b58;
      DVar4 = getAttributeValueAsReferencedDie((DWARFDie *)auStack_d8,DW_AT_abstract_origin);
      D.U = (DWARFUnit *)DVar4.Die;
      local_100 = (undefined1  [8])DVar4.U;
      bVar1 = operator_cast_to_bool((DWARFDie *)local_100);
      if (bVar1) {
        pVar3 = SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
                          ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_b8,
                           (DWARFDie *)local_100);
        D_1.Die._0_4_ = pVar3.first;
        D_1.Die._4_1_ = pVar3.second;
        if (((ulong)pVar3 & 0x100000000) != 0) {
          std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::push_back
                    ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_38,
                     (value_type *)local_100);
        }
      }
      DVar4 = getAttributeValueAsReferencedDie((DWARFDie *)auStack_d8,DW_AT_specification);
      D_1.U = (DWARFUnit *)DVar4.Die;
      local_118 = (undefined1  [8])DVar4.U;
      bVar1 = operator_cast_to_bool((DWARFDie *)local_118);
      if ((bVar1) &&
         (pVar3 = SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
                            ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_b8,
                             (DWARFDie *)local_118), ((ulong)pVar3 & 0x100000000) != 0)) {
        std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::push_back
                  ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_38,
                   (value_type *)local_118);
      }
    }
  }
  Optional<llvm::DWARFFormValue>::Optional(__return_storage_ptr__,None);
LAB_02813b58:
  D.Die._4_4_ = 1;
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::~SmallSet
            ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_b8);
  std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::~vector
            ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue>
DWARFDie::findRecursively(ArrayRef<dwarf::Attribute> Attrs) const {
  std::vector<DWARFDie> Worklist;
  Worklist.push_back(*this);

  // Keep track if DIEs already seen to prevent infinite recursion.
  // Empirically we rarely see a depth of more than 3 when dealing with valid
  // DWARF. This corresponds to following the DW_AT_abstract_origin and
  // DW_AT_specification just once.
  SmallSet<DWARFDie, 3> Seen;
  Seen.insert(*this);

  while (!Worklist.empty()) {
    DWARFDie Die = Worklist.back();
    Worklist.pop_back();

    if (!Die.isValid())
      continue;

    if (auto Value = Die.find(Attrs))
      return Value;

    if (auto D = Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      if (Seen.insert(D).second)
        Worklist.push_back(D);

    if (auto D = Die.getAttributeValueAsReferencedDie(DW_AT_specification))
      if (Seen.insert(D).second)
        Worklist.push_back(D);
  }

  return None;
}